

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTcParser::parse_for_in_clause(CTcParser *this,CTcPrsNode *lval,CTPNForIn **head,CTPNForIn **tail)

{
  tc_toktyp_t tVar1;
  int iVar2;
  int iVar3;
  CTcPrsNode *pCVar4;
  long *in_RCX;
  undefined8 *in_RDX;
  CTPNVarIn *in_RSI;
  CTcParser *in_RDI;
  int step_local;
  int to_local;
  CTcPrsNode *stepExpr;
  CTcPrsNode *toExpr;
  CTPNForIn *in_expr;
  CTcPrsNode *expr;
  int in_stack_ffffffffffffff5c;
  CTcPrsNode *in_stack_ffffffffffffff60;
  CTcTokenizer *in_stack_ffffffffffffff68;
  int to_local_id;
  CTcToken *in_stack_ffffffffffffff70;
  CTcPrsNode *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffffa0;
  CTcPrsNode *local_48;
  CTPNForIn *local_38;
  
  pCVar4 = parse_asi_expr((CTcParser *)0x26a289);
  if (pCVar4 == (CTcPrsNode *)0x0) {
    return (CTcPrsNode *)0x0;
  }
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x26a2b6);
  if (tVar1 == TOKT_DOTDOT) {
    CTcTokenizer::next(in_stack_ffffffffffffff68);
    pCVar4 = parse_asi_expr((CTcParser *)0x26a2d8);
    if (pCVar4 == (CTcPrsNode *)0x0) {
      return (CTcPrsNode *)0x0;
    }
    local_48 = (CTcPrsNode *)0x0;
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x26a30e);
    if (tVar1 == TOKT_SYM) {
      CTcTokenizer::getcur(G_tok);
      iVar2 = CTcToken::text_matches
                        (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                         (size_t)in_stack_ffffffffffffff60);
      if (iVar2 != 0) {
        CTcTokenizer::next(in_stack_ffffffffffffff68);
        local_48 = parse_asi_expr((CTcParser *)0x26a354);
      }
    }
    to_local_id = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    iVar2 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x26a363);
    if (iVar2 == 0) {
      iVar2 = alloc_local(in_RDI);
    }
    else {
      iVar2 = -1;
    }
    if ((local_48 == (CTcPrsNode *)0x0) ||
       (iVar3 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x26a39b), iVar3 != 0)) {
      iVar3 = -1;
    }
    else {
      iVar3 = alloc_local(in_RDI);
    }
    local_38 = (CTPNForIn *)CTcPrsAllocObj::operator_new(0x26a3cb);
    CTPNVarInRange::CTPNVarInRange
              ((CTPNVarInRange *)CONCAT44(iVar2,iVar3),(CTcPrsNode *)local_38,
               (CTcPrsNode *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78,(CTcPrsNode *)in_stack_ffffffffffffff70,to_local_id,
               in_stack_ffffffffffffffa0);
  }
  else {
    local_38 = (CTPNForIn *)CTcPrsAllocObj::operator_new(0x26a43f);
    alloc_local(in_RDI);
    CTPNVarIn::CTPNVarIn
              (in_RSI,(CTcPrsNode *)local_38,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  }
  if (*in_RCX == 0) {
    *in_RDX = local_38;
  }
  else {
    CTPNForInBase::setnxt((CTPNForInBase *)*in_RCX,local_38);
  }
  *in_RCX = (long)local_38;
  return (CTcPrsNode *)local_38;
}

Assistant:

CTcPrsNode *CTcParser::parse_for_in_clause(
    CTcPrsNode *lval, CTPNForIn *&head, CTPNForIn *&tail)
{
    /* 
     *   Parse an assignment expression.  We parse from this point in the
     *   grammar because the entire 'in' clause can be part of a comma
     *   expression, so we want to stop if we reach a comma rather than
     *   treating the comma as part of our own expression.  
     */
    CTcPrsNode *expr = parse_asi_expr();

    /* if that failed, return failure */
    if (expr == 0)
        return 0;

    /* if the next token is "..", we have a "for var in from..to" range */
    CTPNForIn *in_expr;
    if (G_tok->cur() == TOKT_DOTDOT)
    {
        /* skip the ".." and parse the "to" expression */
        G_tok->next();
        CTcPrsNode *toExpr = parse_asi_expr();

        /* if that failed, return failure */
        if (toExpr == 0)
            return 0;

        /* check for the optional "step" expression */
        CTcPrsNode *stepExpr = 0;
        if (G_tok->cur() == TOKT_SYM
            && G_tok->getcur()->text_matches("step", 4))
        {
            /* skip the "step" and parse the expression */
            G_tok->next();
            stepExpr = parse_asi_expr();
        }

        /* 
         *   allocate variables for the "to" and "step" expressions, but only
         *   if they're non-constant 
         */
        int to_local = (toExpr->is_const() ? -1 : alloc_local());
        int step_local = (stepExpr == 0 || stepExpr->is_const() ? -1 :
                          alloc_local());

        /* build the "for x in range" node */
        in_expr = new CTPNVarInRange(lval, expr, toExpr, stepExpr,
                                     to_local, step_local);
    }
    else
    {
        /* it's a plain old "for x in collection" */
        in_expr = new CTPNVarIn(lval, expr, alloc_local());
    }

    /* link it into the list */
    if (tail != 0)
        tail->setnxt(in_expr);
    else
        head = in_expr;
    tail = in_expr;

    /* return the new expression */
    return in_expr;
}